

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pytypes.h
# Opt level: O1

str_attr_accessor * __thiscall
pybind11::detail::
object_api<pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>_>::attr
          (str_attr_accessor *__return_storage_ptr__,
          object_api<pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>_>
          *this,char *key)

{
  PyObject *pPVar1;
  object *poVar2;
  long *plVar3;
  handle local_20;
  
  poVar2 = accessor<pybind11::detail::accessor_policies::str_attr>::get_cache
                     ((accessor<pybind11::detail::accessor_policies::str_attr> *)this);
  pPVar1 = (poVar2->super_handle).m_ptr;
  local_20.m_ptr = pPVar1;
  plVar3 = (long *)__tls_get_addr(&PTR_0019ddc0);
  *plVar3 = *plVar3 + 1;
  if (pPVar1 != (PyObject *)0x0) {
    pPVar1->ob_refcnt = pPVar1->ob_refcnt + 1;
  }
  (__return_storage_ptr__->obj).m_ptr = local_20.m_ptr;
  __return_storage_ptr__->key = key;
  (__return_storage_ptr__->cache).super_handle.m_ptr = (PyObject *)0x0;
  object::~object((object *)&local_20);
  return __return_storage_ptr__;
}

Assistant:

str_attr_accessor object_api<D>::attr(const char *key) const {
    return {derived(), key};
}